

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc_helper.c
# Opt level: O0

target_ulong helper_cc_compute_c_x86_64(target_ulong dst,target_ulong src1,target_ulong src2,int op)

{
  uint8_t dst_00;
  uint16_t dst_01;
  uint8_t src1_00;
  int iVar1;
  uint32_t src1_02;
  uint32_t dst_02;
  int op_local;
  target_ulong src2_local;
  target_ulong src1_local;
  target_ulong dst_local;
  uint16_t src1_01;
  
  dst_00 = (uint8_t)dst;
  dst_01 = (uint16_t)dst;
  dst_02 = (uint32_t)dst;
  src1_00 = (uint8_t)src1;
  src1_01 = (uint16_t)src1;
  src1_02 = (uint32_t)src1;
  switch(op) {
  case 1:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2f:
    dst_local = src1 & 1;
    break;
  case 2:
  case 3:
  case 4:
  case 5:
    dst_local = (target_ulong)(int)(uint)(src1 != 0);
    break;
  case 6:
    iVar1 = compute_c_addb(dst_00,src1_00);
    dst_local = (target_ulong)iVar1;
    break;
  case 7:
    iVar1 = compute_c_addw(dst_01,src1_01);
    dst_local = (target_ulong)iVar1;
    break;
  case 8:
    iVar1 = compute_c_addl(dst_02,src1_02);
    dst_local = (target_ulong)iVar1;
    break;
  case 9:
    iVar1 = compute_c_addq(dst,src1);
    dst_local = (target_ulong)iVar1;
    break;
  case 10:
    iVar1 = compute_c_adcb(dst_00,src1_00,(uint8_t)src2);
    dst_local = (target_ulong)iVar1;
    break;
  case 0xb:
    iVar1 = compute_c_adcw(dst_01,src1_01,(uint16_t)src2);
    dst_local = (target_ulong)iVar1;
    break;
  case 0xc:
    iVar1 = compute_c_adcl(dst_02,src1_02,(uint32_t)src2);
    dst_local = (target_ulong)iVar1;
    break;
  case 0xd:
    iVar1 = compute_c_adcq(dst,src1,src2);
    dst_local = (target_ulong)iVar1;
    break;
  case 0xe:
    iVar1 = compute_c_subb(dst_00,src1_00);
    dst_local = (target_ulong)iVar1;
    break;
  case 0xf:
    iVar1 = compute_c_subw(dst_01,src1_01);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x10:
    iVar1 = compute_c_subl(dst_02,src1_02);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x11:
    iVar1 = compute_c_subq(dst,src1);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x12:
    iVar1 = compute_c_sbbb(dst_00,src1_00,(uint8_t)src2);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x13:
    iVar1 = compute_c_sbbw(dst_01,src1_01,(uint16_t)src2);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x14:
    iVar1 = compute_c_sbbl(dst_02,src1_02,(uint32_t)src2);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x15:
    iVar1 = compute_c_sbbq(dst,src1,src2);
    dst_local = (target_ulong)iVar1;
    break;
  default:
    dst_local = 0;
    break;
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
    dst_local = src1;
    break;
  case 0x22:
    iVar1 = compute_c_shlb(dst_00,src1_00);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x23:
    iVar1 = compute_c_shlw(dst_01,src1_01);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x24:
    iVar1 = compute_c_shll(dst_02,src1_02);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x25:
    iVar1 = compute_c_shlq(dst,src1);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x2a:
    iVar1 = compute_c_bmilgb(dst_00,src1_00);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x2b:
    iVar1 = compute_c_bmilgw(dst_01,src1_01);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x2c:
    iVar1 = compute_c_bmilgl(dst_02,src1_02);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x2d:
    iVar1 = compute_c_bmilgq(dst,src1);
    dst_local = (target_ulong)iVar1;
    break;
  case 0x2e:
  case 0x30:
    dst_local = dst;
  }
  return dst_local;
}

Assistant:

target_ulong helper_cc_compute_c(target_ulong dst, target_ulong src1,
                                 target_ulong src2, int op)
{
    switch (op) {
    default: /* should never happen */
    case CC_OP_LOGICB:
    case CC_OP_LOGICW:
    case CC_OP_LOGICL:
    case CC_OP_LOGICQ:
    case CC_OP_CLR:
    case CC_OP_POPCNT:
        return 0;

    case CC_OP_EFLAGS:
    case CC_OP_SARB:
    case CC_OP_SARW:
    case CC_OP_SARL:
    case CC_OP_SARQ:
    case CC_OP_ADOX:
        return src1 & 1;

    case CC_OP_INCB:
    case CC_OP_INCW:
    case CC_OP_INCL:
    case CC_OP_INCQ:
    case CC_OP_DECB:
    case CC_OP_DECW:
    case CC_OP_DECL:
    case CC_OP_DECQ:
        return src1;

    case CC_OP_MULB:
    case CC_OP_MULW:
    case CC_OP_MULL:
    case CC_OP_MULQ:
        return src1 != 0;

    case CC_OP_ADCX:
    case CC_OP_ADCOX:
        return dst;

    case CC_OP_ADDB:
        return compute_c_addb(dst, src1);
    case CC_OP_ADDW:
        return compute_c_addw(dst, src1);
    case CC_OP_ADDL:
        return compute_c_addl(dst, src1);

    case CC_OP_ADCB:
        return compute_c_adcb(dst, src1, src2);
    case CC_OP_ADCW:
        return compute_c_adcw(dst, src1, src2);
    case CC_OP_ADCL:
        return compute_c_adcl(dst, src1, src2);

    case CC_OP_SUBB:
        return compute_c_subb(dst, src1);
    case CC_OP_SUBW:
        return compute_c_subw(dst, src1);
    case CC_OP_SUBL:
        return compute_c_subl(dst, src1);

    case CC_OP_SBBB:
        return compute_c_sbbb(dst, src1, src2);
    case CC_OP_SBBW:
        return compute_c_sbbw(dst, src1, src2);
    case CC_OP_SBBL:
        return compute_c_sbbl(dst, src1, src2);

    case CC_OP_SHLB:
        return compute_c_shlb(dst, src1);
    case CC_OP_SHLW:
        return compute_c_shlw(dst, src1);
    case CC_OP_SHLL:
        return compute_c_shll(dst, src1);

    case CC_OP_BMILGB:
        return compute_c_bmilgb(dst, src1);
    case CC_OP_BMILGW:
        return compute_c_bmilgw(dst, src1);
    case CC_OP_BMILGL:
        return compute_c_bmilgl(dst, src1);

#ifdef TARGET_X86_64
    case CC_OP_ADDQ:
        return compute_c_addq(dst, src1);
    case CC_OP_ADCQ:
        return compute_c_adcq(dst, src1, src2);
    case CC_OP_SUBQ:
        return compute_c_subq(dst, src1);
    case CC_OP_SBBQ:
        return compute_c_sbbq(dst, src1, src2);
    case CC_OP_SHLQ:
        return compute_c_shlq(dst, src1);
    case CC_OP_BMILGQ:
        return compute_c_bmilgq(dst, src1);
#endif
    }
}